

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
quaternion_costruction_from_components::test_method(quaternion_costruction_from_components *this)

{
  undefined8 local_120;
  undefined8 local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3e);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00113c18;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_58 = "";
  local_120 = 0x3fb999999999999a;
  local_118 = 0x3fb999999999999a;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_60,0x3e,1,2,&local_120,"test.a()",&local_118,"0.1");
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x3f);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00113c18;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_88 = "";
  local_120 = 0x3fe0000000000000;
  local_118 = 0x3fe0000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_90,0x3f,1,2,&local_120,"test.b()",&local_118,"0.5");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x40);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00113c18;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_b8 = "";
  local_120 = 0x3feccccccccccccd;
  local_118 = 0x3feccccccccccccd;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_110,&local_c0,0x40,1,2,&local_120,"test.c()",&local_118,"0.9");
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x41);
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00113c18;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
  ;
  local_e8 = "";
  local_120 = 0x3ff0000000000000;
  local_118 = CONCAT44(local_118._4_4_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,int>
            (&local_110,&local_f0,0x41,1,2,&local_120,"test.d()",&local_118,"1");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_costruction_from_components) {
    Quaternion<double> test(0.1,0.5,0.9,1);
    BOOST_CHECK_EQUAL(test.a(), 0.1);
    BOOST_CHECK_EQUAL(test.b(), 0.5);
    BOOST_CHECK_EQUAL(test.c(), 0.9);
    BOOST_CHECK_EQUAL(test.d(), 1);
}